

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall brynet::net::EventLoop::processAsyncProcs(EventLoop *this)

{
  bool bVar1;
  reference this_00;
  function<void_()> *x;
  iterator __end1;
  iterator __begin1;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range1;
  lock_guard<std::mutex> lck;
  EventLoop *this_local;
  
  lck._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&__range1,&this->mAsyncProcsMutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::swap
            (&this->mCopyAsyncProcs,&this->mAsyncProcs);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
  __end1 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::begin
                     (&this->mCopyAsyncProcs);
  x = (function<void_()> *)
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::end
                (&this->mCopyAsyncProcs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                                *)&x);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
              ::operator*(&__end1);
    std::function<void_()>::operator()(this_00);
    __gnu_cxx::
    __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::clear
            (&this->mCopyAsyncProcs);
  return;
}

Assistant:

void EventLoop::processAsyncProcs()
{
    {
        std::lock_guard<std::mutex> lck(mAsyncProcsMutex);
        mCopyAsyncProcs.swap(mAsyncProcs);
    }

    for (const auto& x : mCopyAsyncProcs)
    {
        x();
    }
    mCopyAsyncProcs.clear();
}